

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

run_container_t * run_container_create_range(uint32_t start,uint32_t stop)

{
  run_container_t *prVar1;
  
  prVar1 = run_container_create_given_capacity(1);
  if (prVar1 != (run_container_t *)0x0) {
    prVar1->runs[prVar1->n_runs] = (rle16_t)(start & 0xffff | (~start + stop) * 0x10000);
    prVar1->n_runs = prVar1->n_runs + 1;
  }
  return prVar1;
}

Assistant:

static inline run_container_t *run_container_create_range(uint32_t start,
                                                          uint32_t stop) {
    run_container_t *rc = run_container_create_given_capacity(1);
    if (rc) {
        rle16_t r;
        r.value = (uint16_t)start;
        r.length = (uint16_t)(stop - start - 1);
        run_container_append_first(rc, r);
    }
    return rc;
}